

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::append_name(path *this,value_type *name)

{
  size_type sVar1;
  value_type *name_local;
  path local_30;
  
  sVar1 = (this->_path)._M_string_length;
  name_local = name;
  if (sVar1 != 0) {
    if ((this->_path)._M_dataplus._M_p[sVar1 - 1] != '/') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::append((char *)this);
    return;
  }
  path<char_const*,ghc::filesystem::path>(&local_30,&name_local,auto_format);
  operator/=(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

GHC_INLINE void path::append_name(const value_type* name)
{
    if (_path.empty()) {
        this->operator/=(path(name));
    }
    else {
        if (_path.back() != path::preferred_separator) {
            _path.push_back(path::preferred_separator);
        }
        _path += name;
        check_long_path();
    }
}